

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  lexeme_t lVar1;
  xpath_value_type xVar2;
  xpath_variable_set *this_01;
  char_t *pcVar3;
  bool *pbVar4;
  size_t sVar5;
  bool bVar6;
  char cVar7;
  byte bVar8;
  nodetest_t nVar9;
  xpath_ast_node *pxVar10;
  xpath_variable *__dest;
  char_t *pcVar11;
  ulong uVar12;
  xpath_parse_result *pxVar13;
  ulong uVar14;
  xpath_ast_node *pxVar15;
  xpath_ast_node *pxVar16;
  byte *pbVar17;
  char *pcVar18;
  xpath_ast_node **ppxVar19;
  xpath_ast_node *unaff_R15;
  size_t __n;
  xpath_ast_node *args [2];
  xpath_ast_node *local_58 [2];
  xpath_lexer_string local_48;
  double local_38;
  
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lex_string < lVar1) {
LAB_0038ab52:
    pxVar15 = parse_location_path(this);
    return pxVar15;
  }
  this_00 = &this->_lexer;
  if ((0xd800U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0) {
    if (lVar1 == lex_minus) {
      xpath_lexer::next(this_00);
      pxVar15 = parse_expression(this,7);
      if (pxVar15 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '\x0e';
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      pxVar10->_left = pxVar15;
      pxVar10->_right = (xpath_ast_node *)0x0;
      pxVar10->_next = (xpath_ast_node *)0x0;
      return pxVar10;
    }
    if (lVar1 != lex_string) goto LAB_0038ab52;
    pbVar17 = (byte *)this_00->_cur;
    do {
      bVar8 = *pbVar17;
      pbVar17 = pbVar17 + 1;
    } while (((ulong)((xpath_lexer_string *)(ulong)bVar8)[0x43ae4].begin & 8) != 0);
    if ((bVar8 == 0x28) &&
       (nVar9 = parse_node_test_type
                          ((xpath_parser *)&(this->_lexer)._cur_lexeme_contents,
                           (xpath_lexer_string *)(ulong)bVar8), nVar9 == nodetest_none)) {
      bVar6 = true;
    }
    else {
      unaff_R15 = parse_location_path(this);
      bVar6 = false;
    }
    if (!bVar6) {
      return unaff_R15;
    }
  }
  switch((this->_lexer)._cur_lexeme) {
  case lex_var_ref:
    this_01 = this->_variables;
    if (this_01 != (xpath_variable_set *)0x0) {
      pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar14 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
      pcVar11 = this->_scratch;
      if ((uVar14 < 0x20) ||
         (pcVar11 = (char_t *)
                    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                              allocate)(uVar14 + 1), pcVar11 != (char_t *)0x0)) {
        memcpy(pcVar11,pcVar3,uVar14);
        pcVar11[uVar14] = '\0';
        __dest = xpath_variable_set::_find(this_01,pcVar11);
        bVar6 = true;
        if (pcVar11 != this->_scratch) {
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    (pcVar11);
        }
      }
      else {
        __dest = (xpath_variable *)0x0;
        bVar6 = false;
      }
      if (bVar6) {
        if (__dest == (xpath_variable *)0x0) {
          pxVar13 = this->_result;
          pcVar18 = "Unknown variable: variable set does not contain the given name";
          goto LAB_0038b7f5;
        }
        xpath_lexer::next(this_00);
        xVar2 = __dest->_type;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 != (xpath_ast_node *)0x0) {
          pxVar10->_type = '\x14';
          pxVar10->_rettype = (char)xVar2;
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          goto LAB_0038af2a;
        }
      }
      else {
        pbVar4 = this->_alloc->_error;
        if (pbVar4 == (bool *)0x0) goto LAB_0038b9d6;
        *pbVar4 = true;
      }
      goto LAB_0038b804;
    }
    pxVar13 = this->_result;
    pcVar18 = "Unknown variable: variable set is not provided";
    break;
  case lex_open_brace:
    xpath_lexer::next(this_00);
    pxVar10 = (xpath_ast_node *)0x0;
    pxVar15 = parse_expression(this,0);
    if (pxVar15 != (xpath_ast_node *)0x0) {
      if ((this->_lexer)._cur_lexeme != lex_close_brace) {
        pxVar13 = this->_result;
        pcVar18 = "Expected \')\' to match an opening \'(\'";
LAB_0038b7f5:
        pxVar13->error = pcVar18;
        pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        goto LAB_0038b804;
      }
      xpath_lexer::next(this_00);
      pxVar10 = pxVar15;
    }
    goto LAB_0038b80c;
  default:
    pxVar13 = this->_result;
    pcVar18 = "Unrecognizable primary expression";
    break;
  case lex_quoted_string:
    pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar3 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x41f4cd;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        __dest = (xpath_variable *)0x0;
      }
      else {
        memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
        *(char *)((long)__dest + __n) = '\0';
      }
    }
    if (__dest != (xpath_variable *)0x0) {
      xpath_lexer::next(this_00);
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 != (xpath_ast_node *)0x0) {
        pxVar10->_type = '\x12';
        pxVar10->_rettype = '\x03';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
LAB_0038af2a:
        pxVar10->_left = (xpath_ast_node *)0x0;
        pxVar10->_right = (xpath_ast_node *)0x0;
        pxVar10->_next = (xpath_ast_node *)0x0;
        (pxVar10->_data).string = (char_t *)__dest;
        goto LAB_0038b80c;
      }
    }
LAB_0038b804:
    pxVar10 = (xpath_ast_node *)0x0;
    goto LAB_0038b80c;
  case lex_number:
    pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar14 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
    pcVar11 = this->_scratch;
    if ((uVar14 < 0x20) ||
       (pcVar11 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar14 + 1), pcVar11 != (char_t *)0x0)) {
      memcpy(pcVar11,pcVar3,uVar14);
      pcVar11[uVar14] = '\0';
      local_38 = convert_string_to_number(pcVar11);
      bVar6 = true;
      if (pcVar11 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar11);
      }
    }
    else {
      local_38 = 0.0;
      bVar6 = false;
    }
    if (bVar6) {
      xpath_lexer::next(this_00);
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 != (xpath_ast_node *)0x0) {
        pxVar10->_type = '\x13';
        pxVar10->_rettype = '\x02';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        pxVar10->_left = (xpath_ast_node *)0x0;
        pxVar10->_right = (xpath_ast_node *)0x0;
        pxVar10->_next = (xpath_ast_node *)0x0;
        (pxVar10->_data).number = local_38;
        goto LAB_0038b80c;
      }
    }
    else {
      pbVar4 = this->_alloc->_error;
      if (pbVar4 == (bool *)0x0) {
LAB_0038b9d6:
        __assert_fail("_alloc->_error",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2c5f,
                      "xpath_ast_node *pugi::impl::(anonymous namespace)::xpath_parser::error_oom()"
                     );
      }
      *pbVar4 = true;
    }
    goto LAB_0038ae50;
  case lex_string:
    local_58[0] = (xpath_ast_node *)0x0;
    local_58[1] = (xpath_ast_node *)0x0;
    local_48.begin = (this->_lexer)._cur_lexeme_contents.begin;
    local_48.end = (this->_lexer)._cur_lexeme_contents.end;
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme == lex_open_brace) {
      xpath_lexer::next(this_00);
      sVar5 = this->_depth;
      pxVar10 = (xpath_ast_node *)0x0;
      uVar14 = 0;
      pxVar15 = (xpath_ast_node *)0x0;
LAB_0038acf1:
      lVar1 = (this->_lexer)._cur_lexeme;
      if (lVar1 != lex_close_brace) {
        if (uVar14 != 0) {
          if (lVar1 != lex_comma) {
            pxVar13 = this->_result;
            pcVar18 = "No comma between function arguments";
            goto LAB_0038b7f5;
          }
          xpath_lexer::next(this_00);
        }
        uVar12 = this->_depth + 1;
        this->_depth = uVar12;
        if (uVar12 < 0x401) goto code_r0x0038ad2c;
        pxVar13 = this->_result;
        pcVar18 = "Exceeded maximum allowed query depth";
        goto LAB_0038b7f5;
      }
      xpath_lexer::next(this_00);
      this->_depth = sVar5;
      switch(*local_48.begin) {
      case 'b':
        bVar6 = xpath_lexer_string::operator==(&local_48,"boolean");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar6)) goto switchD_0038ae88_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
        pxVar10->_type = '-';
        pxVar10->_rettype = '\x04';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'c':
        bVar6 = xpath_lexer_string::operator==(&local_48,"count");
        pxVar15 = local_58[0];
        if ((uVar14 == 1) && (bVar6)) {
          if (local_58[0]->_rettype != '\x01') goto LAB_0038b9c6;
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038ae50;
          pxVar10->_type = '\x17';
          pxVar10->_rettype = '\x02';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          pxVar10->_left = pxVar15;
          pxVar10->_right = (xpath_ast_node *)0x0;
          pxVar10->_next = (xpath_ast_node *)0x0;
          goto LAB_0038b80c;
        }
        bVar6 = xpath_lexer_string::operator==(&local_48,"contains");
        pxVar16 = local_58[1];
        pxVar15 = local_58[0];
        if ((uVar14 == 2) && (bVar6)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
          pxVar10->_type = '#';
          pxVar10->_rettype = '\x04';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
        }
        else {
          bVar6 = xpath_lexer_string::operator==(&local_48,"concat");
          pxVar16 = local_58[1];
          pxVar15 = local_58[0];
          if ((uVar14 < 2) || (!bVar6)) {
            bVar6 = xpath_lexer_string::operator==(&local_48,"ceiling");
            pxVar15 = local_58[0];
            if ((uVar14 != 1) || (!bVar6)) goto switchD_0038ae88_caseD_64;
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 != (xpath_ast_node *)0x0) {
              pxVar10->_type = '6';
              pxVar10->_rettype = '\x02';
              pxVar10->_axis = '\0';
              pxVar10->_test = '\0';
              break;
            }
            goto LAB_0038b804;
          }
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
          pxVar10->_type = '!';
          pxVar10->_rettype = '\x03';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
        }
LAB_0038b73b:
        pxVar10->_left = pxVar15;
        pxVar10->_right = pxVar16;
LAB_0038b743:
        pxVar10->_next = (xpath_ast_node *)0x0;
        goto LAB_0038b80c;
      default:
        goto switchD_0038ae88_caseD_64;
      case 'f':
        bVar6 = xpath_lexer_string::operator==(&local_48,"false");
        if ((uVar14 == 0) && (bVar6)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = '0';
            pxVar10->_rettype = '\x04';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
LAB_0038b3d5:
            pxVar10->_left = (xpath_ast_node *)0x0;
            pxVar10->_right = (xpath_ast_node *)0x0;
            goto LAB_0038b743;
          }
          goto LAB_0038b804;
        }
        bVar6 = xpath_lexer_string::operator==(&local_48,"floor");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar6)) goto switchD_0038ae88_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
        pxVar10->_type = '5';
        pxVar10->_rettype = '\x02';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'i':
        bVar6 = xpath_lexer_string::operator==(&local_48,"id");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar6)) goto switchD_0038ae88_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
        pxVar10->_type = '\x18';
        pxVar10->_rettype = '\x01';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'l':
        bVar6 = xpath_lexer_string::operator==(&local_48,"last");
        if ((uVar14 == 0) && (bVar6)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = '\x15';
            pxVar10->_rettype = '\x02';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_0038b3d5;
          }
          goto LAB_0038b804;
        }
        bVar6 = xpath_lexer_string::operator==(&local_48,"lang");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar6)) {
          bVar6 = xpath_lexer_string::operator==(&local_48,"local-name");
          pxVar15 = local_58[0];
          if ((1 < uVar14) || (!bVar6)) goto switchD_0038ae88_caseD_64;
          if ((uVar14 == 1) && (local_58[0]->_rettype != '\x01')) goto LAB_0038b9c6;
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            cVar7 = '\x1a';
            goto LAB_0038b551;
          }
          goto LAB_0038b804;
        }
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
        pxVar10->_type = '1';
        pxVar10->_rettype = '\x04';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'n':
        bVar6 = xpath_lexer_string::operator==(&local_48,"name");
        pxVar15 = local_58[0];
        if ((uVar14 < 2) && (bVar6)) {
          if ((uVar14 != 1) || (local_58[0]->_rettype == '\x01')) {
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 != (xpath_ast_node *)0x0) {
              cVar7 = '\x1e';
              goto LAB_0038b551;
            }
            goto LAB_0038b804;
          }
        }
        else {
          bVar6 = xpath_lexer_string::operator==(&local_48,"namespace-uri");
          pxVar15 = local_58[0];
          if ((1 < uVar14) || (!bVar6)) {
            bVar6 = xpath_lexer_string::operator==(&local_48,"normalize-space");
            pxVar16 = local_58[1];
            pxVar15 = local_58[0];
            if ((uVar14 < 2) && (bVar6)) {
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 != (xpath_ast_node *)0x0) {
                bVar8 = uVar14 == 0 ^ 0x2b;
LAB_0038b488:
                pxVar10->_type = bVar8;
                pxVar10->_rettype = '\x03';
                pxVar10->_axis = '\0';
                pxVar10->_test = '\0';
                pxVar10->_left = pxVar15;
                pxVar10->_right = pxVar16;
                goto LAB_0038b743;
              }
            }
            else {
              bVar6 = xpath_lexer_string::operator==(&local_48,"not");
              pxVar15 = local_58[0];
              if ((uVar14 == 1) && (bVar6)) {
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar10 != (xpath_ast_node *)0x0) {
                  pxVar10->_type = '.';
                  pxVar10->_rettype = '\x04';
                  pxVar10->_axis = '\0';
                  pxVar10->_test = '\0';
                  break;
                }
              }
              else {
                bVar6 = xpath_lexer_string::operator==(&local_48,"number");
                pxVar15 = local_58[0];
                if ((1 < uVar14) || (!bVar6)) goto switchD_0038ae88_caseD_64;
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar10 != (xpath_ast_node *)0x0) {
                  bVar8 = uVar14 == 0 ^ 0x33;
                  goto LAB_0038b42b;
                }
              }
            }
            goto LAB_0038b804;
          }
          if ((uVar14 != 1) || (local_58[0]->_rettype == '\x01')) {
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 != (xpath_ast_node *)0x0) {
              cVar7 = '\x1c';
              goto LAB_0038b551;
            }
            goto LAB_0038b804;
          }
        }
LAB_0038b9c6:
        pxVar13 = this->_result;
        pcVar18 = "Function has to be applied to node set";
        goto LAB_0038b7f5;
      case 'p':
        bVar6 = xpath_lexer_string::operator==(&local_48,"position");
        if ((uVar14 != 0) || (!bVar6)) goto switchD_0038ae88_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 != (xpath_ast_node *)0x0) {
          pxVar10->_type = '\x16';
          pxVar10->_rettype = '\x02';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          goto LAB_0038b3d5;
        }
        goto LAB_0038b804;
      case 'r':
        bVar6 = xpath_lexer_string::operator==(&local_48,"round");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar6)) goto switchD_0038ae88_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
        pxVar10->_type = '7';
        pxVar10->_rettype = '\x02';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 's':
        bVar6 = xpath_lexer_string::operator==(&local_48,"string");
        pxVar15 = local_58[0];
        if ((uVar14 < 2) && (bVar6)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
          cVar7 = ' ';
LAB_0038b551:
          pxVar10->_type = cVar7 - (uVar14 == 0);
          pxVar10->_rettype = '\x03';
          pxVar10->_axis = '\0';
        }
        else {
          bVar6 = xpath_lexer_string::operator==(&local_48,"string-length");
          pxVar15 = local_58[0];
          if ((1 < uVar14) || (!bVar6)) {
            bVar6 = xpath_lexer_string::operator==(&local_48,"starts-with");
            pxVar16 = local_58[1];
            pxVar15 = local_58[0];
            if ((uVar14 == 2) && (bVar6)) {
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 != (xpath_ast_node *)0x0) {
                pxVar10->_type = '\"';
                pxVar10->_rettype = '\x04';
                pxVar10->_axis = '\0';
                pxVar10->_test = '\0';
                goto LAB_0038b73b;
              }
              goto LAB_0038b804;
            }
            bVar6 = xpath_lexer_string::operator==(&local_48,"substring-before");
            pxVar16 = local_58[1];
            pxVar15 = local_58[0];
            if ((uVar14 == 2) && (bVar6)) {
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
              pxVar10->_type = '$';
              pxVar10->_rettype = '\x03';
              pxVar10->_axis = '\0';
              pxVar10->_test = '\0';
            }
            else {
              bVar6 = xpath_lexer_string::operator==(&local_48,"substring-after");
              pxVar16 = local_58[1];
              pxVar15 = local_58[0];
              if ((uVar14 != 2) || (!bVar6)) {
                bVar6 = xpath_lexer_string::operator==(&local_48,"substring");
                pxVar16 = local_58[1];
                pxVar15 = local_58[0];
                if (((uVar14 & 0xfffffffffffffffe) == 2) && (bVar6)) {
                  pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                  if (pxVar10 != (xpath_ast_node *)0x0) {
                    bVar8 = uVar14 == 2 ^ 0x27;
                    goto LAB_0038b488;
                  }
                }
                else {
                  bVar6 = xpath_lexer_string::operator==(&local_48,"sum");
                  pxVar15 = local_58[0];
                  if ((uVar14 != 1) || (!bVar6)) goto switchD_0038ae88_caseD_64;
                  if (local_58[0]->_rettype != '\x01') goto LAB_0038b9c6;
                  pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                  if (pxVar10 != (xpath_ast_node *)0x0) {
                    pxVar10->_type = '4';
                    pxVar10->_rettype = '\x02';
                    pxVar10->_axis = '\0';
                    pxVar10->_test = '\0';
                    break;
                  }
                }
                goto LAB_0038b804;
              }
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
              pxVar10->_type = '%';
              pxVar10->_rettype = '\x03';
              pxVar10->_axis = '\0';
              pxVar10->_test = '\0';
            }
            goto LAB_0038b73b;
          }
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_0038b804;
          bVar8 = uVar14 == 0 ^ 0x29;
LAB_0038b42b:
          pxVar10->_type = bVar8;
          pxVar10->_rettype = '\x02';
          pxVar10->_axis = '\0';
        }
        pxVar10->_test = '\0';
        break;
      case 't':
        bVar6 = xpath_lexer_string::operator==(&local_48,"translate");
        pxVar16 = local_58[1];
        pxVar15 = local_58[0];
        if ((uVar14 == 3) && (bVar6)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = ',';
            pxVar10->_rettype = '\x03';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_0038b73b;
          }
          goto LAB_0038b804;
        }
        bVar6 = xpath_lexer_string::operator==(&local_48,"true");
        if ((uVar14 == 0) && (bVar6)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = '/';
            pxVar10->_rettype = '\x04';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_0038b3d5;
          }
          goto LAB_0038b804;
        }
switchD_0038ae88_caseD_64:
        pxVar13 = this->_result;
        pcVar18 = "Unrecognized function or wrong parameter count";
        goto LAB_0038b7f5;
      }
      pxVar10->_left = pxVar15;
      pxVar10->_right = (xpath_ast_node *)0x0;
      pxVar10->_next = (xpath_ast_node *)0x0;
      goto LAB_0038b80c;
    }
    pxVar13 = this->_result;
    pcVar18 = "Unrecognized function call";
  }
  pxVar13->error = pcVar18;
  pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
LAB_0038ae50:
  pxVar10 = (xpath_ast_node *)0x0;
LAB_0038b80c:
  if (pxVar10 != (xpath_ast_node *)0x0) {
    sVar5 = this->_depth;
    do {
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        this->_depth = sVar5;
        goto LAB_0038b916;
      }
      xpath_lexer::next(this_00);
      uVar14 = this->_depth + 1;
      this->_depth = uVar14;
      if (0x400 < uVar14) {
        pxVar13 = this->_result;
        pcVar18 = "Exceeded maximum allowed query depth";
LAB_0038b904:
        pxVar13->error = pcVar18;
        pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        break;
      }
      if (pxVar10->_rettype != '\x01') {
        pxVar13 = this->_result;
        pcVar18 = "Predicate has to be applied to node set";
        goto LAB_0038b904;
      }
      bVar6 = false;
      pxVar15 = parse_expression(this,0);
      if (pxVar15 != (xpath_ast_node *)0x0) {
        pxVar16 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar16 == (xpath_ast_node *)0x0) {
          pxVar10 = (xpath_ast_node *)0x0;
        }
        else {
          pxVar16->_type = '\x11';
          pxVar16->_rettype = '\x01';
          pxVar16->_axis = '\0';
          pxVar16->_test = '\0';
          pxVar16->_left = pxVar10;
          pxVar16->_right = pxVar15;
          pxVar16->_next = (xpath_ast_node *)0x0;
          pxVar10 = pxVar16;
        }
        if (pxVar10 == (xpath_ast_node *)0x0) {
          bVar6 = false;
          pxVar10 = (xpath_ast_node *)0x0;
        }
        else if ((this->_lexer)._cur_lexeme == lex_close_square_brace) {
          xpath_lexer::next(this_00);
          bVar6 = true;
        }
        else {
          pxVar13 = this->_result;
          pxVar13->error = "Expected \']\' to match an opening \'[\'";
          pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
          bVar6 = false;
        }
      }
    } while (bVar6);
  }
  pxVar10 = (xpath_ast_node *)0x0;
LAB_0038b916:
  if (pxVar10 != (xpath_ast_node *)0x0) {
    lVar1 = (this->_lexer)._cur_lexeme;
    if ((lVar1 & ~lex_equal) != lex_slash) {
      return pxVar10;
    }
    xpath_lexer::next(this_00);
    pxVar15 = pxVar10;
    if (lVar1 != lex_double_slash) {
LAB_0038b998:
      pxVar15 = parse_relative_location_path(this,pxVar15);
      return pxVar15;
    }
    if (pxVar10->_rettype == '\x01') {
      pxVar15 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar15 == (xpath_ast_node *)0x0) {
        pxVar15 = (xpath_ast_node *)0x0;
      }
      else {
        pxVar15->_type = '8';
        pxVar15->_rettype = '\x01';
        pxVar15->_axis = '\x05';
        pxVar15->_test = '\x02';
        pxVar15->_left = pxVar10;
        pxVar15->_right = (xpath_ast_node *)0x0;
        pxVar15->_next = (xpath_ast_node *)0x0;
        (pxVar15->_data).string = (char_t *)0x0;
      }
      if (pxVar15 != (xpath_ast_node *)0x0) goto LAB_0038b998;
    }
    else {
      pxVar13 = this->_result;
      pxVar13->error = "Step has to be applied to node set";
      pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
    }
  }
  return (xpath_ast_node *)0x0;
code_r0x0038ad2c:
  pxVar16 = parse_expression(this,0);
  if (pxVar16 != (xpath_ast_node *)0x0) {
    ppxVar19 = local_58 + uVar14;
    if (1 < uVar14) {
      ppxVar19 = &pxVar15->_next;
    }
    *ppxVar19 = pxVar16;
    uVar14 = uVar14 + 1;
    pxVar15 = pxVar16;
  }
  if (pxVar16 == (xpath_ast_node *)0x0) goto LAB_0038b80c;
  goto LAB_0038acf1;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}